

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

Matrix<double,_4,_3> * tcu::operator*(Matrix<double,_4,_1> *a,Matrix<double,_1,_3> *b)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double *pdVar4;
  int row_1;
  undefined8 *puVar5;
  double *in_RDI;
  long lVar6;
  int row;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  bool bVar11;
  undefined8 uVar12;
  long lVar10;
  
  pdVar4 = in_RDI;
  in_RDI[10] = 0.0;
  in_RDI[0xb] = 0.0;
  in_RDI[8] = 0.0;
  in_RDI[9] = 0.0;
  in_RDI[6] = 0.0;
  in_RDI[7] = 0.0;
  in_RDI[4] = 0.0;
  in_RDI[5] = 0.0;
  in_RDI[2] = 0.0;
  in_RDI[3] = 0.0;
  *in_RDI = 0.0;
  in_RDI[1] = 0.0;
  auVar3 = _DAT_019fcc00;
  auVar2 = _DAT_019f5ce0;
  puVar5 = in_RDI + 4;
  lVar6 = 0;
  lVar7 = 0;
  do {
    lVar8 = 0;
    auVar9 = auVar3;
    do {
      bVar11 = SUB164(auVar9 ^ auVar2,4) == -0x80000000 && SUB164(auVar9 ^ auVar2,0) < -0x7ffffffd;
      if (bVar11) {
        uVar12 = 0x3ff0000000000000;
        if (lVar6 != lVar8) {
          uVar12 = 0;
        }
        *(undefined8 *)((long)puVar5 + lVar8 + -0x20) = uVar12;
      }
      if (bVar11) {
        uVar12 = 0x3ff0000000000000;
        if (lVar6 + -0x20 != lVar8) {
          uVar12 = 0;
        }
        *(undefined8 *)((long)puVar5 + lVar8) = uVar12;
      }
      lVar10 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar10 + 2;
      lVar8 = lVar8 + 0x40;
    } while (lVar8 != 0x80);
    lVar7 = lVar7 + 1;
    lVar6 = lVar6 + 0x20;
    puVar5 = puVar5 + 1;
  } while (lVar7 != 4);
  lVar6 = 0;
  do {
    dVar1 = (a->m_data).m_data[0].m_data[lVar6];
    lVar7 = 0;
    do {
      *(double *)((long)in_RDI + lVar7 * 4) =
           *(double *)((long)(b->m_data).m_data[0].m_data + lVar7) * dVar1 + 0.0;
      lVar7 = lVar7 + 8;
    } while (lVar7 != 0x18);
    lVar6 = lVar6 + 1;
    in_RDI = in_RDI + 1;
  } while (lVar6 != 4);
  return (Matrix<double,_4,_3> *)pdVar4;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}